

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::~MakeCurrentPerfCase(MakeCurrentPerfCase *this)

{
  pointer puVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  pointer ppvVar4;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MakeCurrentPerfCase_003ec428;
  deinit(this);
  puVar1 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_samples).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ppNVar2 = (this->m_pixmaps).
            super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2,(long)(this->m_pixmaps).
                                  super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar2
                   );
  }
  ppNVar3 = (this->m_windows).
            super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3,(long)(this->m_windows).
                                  super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar3
                   );
  }
  ppvVar4 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar4 != (pointer)0x0) {
    operator_delete(ppvVar4,(long)(this->m_surfaces).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar4);
  }
  ppvVar4 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar4 != (pointer)0x0) {
    operator_delete(ppvVar4,(long)(this->m_contexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar4);
  }
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

MakeCurrentPerfCase::~MakeCurrentPerfCase (void)
{
	deinit();
}